

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::setMaximumDate(QCalendarModel *this,QDate d)

{
  long lVar1;
  bool bVar2;
  QDate *in_RSI;
  QDate *in_RDI;
  long in_FS_OFFSET;
  QDate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QDate::isValid(in_RSI);
  if ((bVar2) && (bVar2 = ::operator==(in_RDI,in_stack_ffffffffffffffd8), !bVar2)) {
    in_RDI[6].jd = (qint64)in_RSI;
    bVar2 = operator>(in_RDI,in_stack_ffffffffffffffd8);
    if (bVar2) {
      in_RDI[5].jd = in_RDI[6].jd;
    }
    bVar2 = operator>(in_RDI,in_stack_ffffffffffffffd8);
    if (bVar2) {
      in_RDI[4].jd = in_RDI[6].jd;
    }
    internalUpdate((QCalendarModel *)d.jd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarModel::setMaximumDate(QDate d)
{
    if (!d.isValid() || d == m_maximumDate)
        return;

    m_maximumDate = d;
    if (m_minimumDate > m_maximumDate)
        m_minimumDate = m_maximumDate;
    if (m_date > m_maximumDate)
        m_date = m_maximumDate;
    internalUpdate();
}